

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

Symbol * __thiscall
vkt::shaderexecutor::PrecisionCase::makeSymbol<tcu::Vector<int,2>>
          (Symbol *__return_storage_ptr__,PrecisionCase *this,
          Variable<tcu::Vector<int,_2>_> *variable)

{
  pointer pcVar1;
  string local_50;
  VarType local_30;
  
  pcVar1 = (variable->m_name)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (variable->m_name)._M_string_length);
  glu::VarType::VarType(&local_30,TYPE_INT_VEC2,(this->m_ctx).precision);
  Symbol::Symbol(__return_storage_ptr__,&local_50,&local_30);
  glu::VarType::~VarType(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Symbol				makeSymbol		(const Variable<T>& variable)
	{
		return Symbol(variable.getName(), getVarTypeOf<T>(m_ctx.precision));
	}